

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void * xmlCopyNotation(void *payload,xmlChar *name)

{
  undefined8 *puVar1;
  xmlChar *pxVar2;
  
  puVar1 = (undefined8 *)(*xmlMalloc)(0x18);
  if (puVar1 == (undefined8 *)0x0) {
    xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
  }
  else {
    if (*payload == (xmlChar *)0x0) {
      pxVar2 = (xmlChar *)0x0;
    }
    else {
      pxVar2 = xmlStrdup(*payload);
    }
    *puVar1 = pxVar2;
    if (*(xmlChar **)((long)payload + 8) == (xmlChar *)0x0) {
      pxVar2 = (xmlChar *)0x0;
    }
    else {
      pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 8));
    }
    puVar1[1] = pxVar2;
    if (*(xmlChar **)((long)payload + 0x10) == (xmlChar *)0x0) {
      puVar1[2] = 0;
    }
    else {
      pxVar2 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
      puVar1[2] = pxVar2;
    }
  }
  return puVar1;
}

Assistant:

static void *
xmlCopyNotation(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlNotationPtr nota = (xmlNotationPtr) payload;
    xmlNotationPtr cur;

    cur = (xmlNotationPtr) xmlMalloc(sizeof(xmlNotation));
    if (cur == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    if (nota->name != NULL)
	cur->name = xmlStrdup(nota->name);
    else
	cur->name = NULL;
    if (nota->PublicID != NULL)
	cur->PublicID = xmlStrdup(nota->PublicID);
    else
	cur->PublicID = NULL;
    if (nota->SystemID != NULL)
	cur->SystemID = xmlStrdup(nota->SystemID);
    else
	cur->SystemID = NULL;
    return(cur);
}